

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O0

void output_proc(Proc *proc,TextBuffer *mb)

{
  int local_24;
  int i;
  BasicBlock *bb;
  TextBuffer *mb_local;
  Proc *proc_local;
  
  raviX_buffer_add_fstring(mb,"define Proc%%%d\n",(ulong)proc->id);
  for (local_24 = 0; local_24 < (int)proc->node_count; local_24 = local_24 + 1) {
    output_basic_block(proc,proc->nodes[local_24],mb);
  }
  return;
}

Assistant:

static void output_proc(Proc *proc, TextBuffer *mb)
{
	BasicBlock *bb;
	raviX_buffer_add_fstring(mb, "define Proc%%%d\n", proc->id);
	for (int i = 0; i < (int)proc->node_count; i++) {
		bb = proc->nodes[i];
		output_basic_block(proc, bb, mb);
	}
}